

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::UniqueMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<const_ON_Mesh> *psVar2;
  
  psVar2 = SharedMesh(this,mesh_type);
  if ((((psVar2->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) &&
      (p_Var1 = (psVar2->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
     (1 < p_Var1->_M_use_count)) {
    std::make_shared<ON_Mesh_const,ON_Mesh_const&>((ON_Mesh *)&stack0xffffffffffffffd8);
    SetMesh(this,mesh_type,(shared_ptr<const_ON_Mesh> *)&stack0xffffffffffffffd8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    psVar2 = SharedMesh(this,mesh_type);
  }
  return psVar2;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::UniqueMesh(ON::mesh_type mesh_type)
{
  const auto& sp = SharedMesh(mesh_type);

  if (sp && sp.use_count() > 1)
  {
    SetMesh(mesh_type, std::make_shared<const ON_Mesh>(*sp));
    return SharedMesh(mesh_type);
  }

  return sp;
}